

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O1

void __thiscall
moira::Moira::execAddRgEa<(moira::Instr)118,(moira::Mode)6,(moira::Size)2>(Moira *this,u16 opcode)

{
  ushort uVar1;
  u32 addr;
  u32 uVar2;
  undefined8 in_RAX;
  bool bVar3;
  ulong uVar4;
  bool error;
  bool local_21;
  
  local_21 = SUB81((ulong)in_RAX >> 0x38,0);
  addr = computeEA<(moira::Mode)6,(moira::Size)2,0ul>(this,opcode & 7);
  uVar2 = readM<(moira::MemSpace)1,(moira::Size)2,128ul>(this,addr,&local_21);
  if (local_21 == false) {
    uVar1 = *(ushort *)((long)this->exec + (ulong)(opcode >> 9 & 7) * 4 + -0x58);
    uVar4 = (ulong)uVar2 - (ulong)uVar1;
    bVar3 = (bool)((byte)(uVar4 >> 0x10) & 1);
    (this->reg).sr.c = bVar3;
    (this->reg).sr.x = bVar3;
    (this->reg).sr.v = (bool)((byte)(((uVar2 ^ (uint)uVar4) & (uVar1 ^ uVar2)) >> 0xf) & 1);
    (this->reg).sr.z = (short)uVar4 == 0;
    (this->reg).sr.n = (bool)((byte)(uVar4 >> 0xf) & 1);
    uVar2 = (this->reg).pc;
    (this->reg).pc0 = uVar2;
    (this->queue).ird = (this->queue).irc;
    uVar2 = readM<(moira::MemSpace)2,(moira::Size)2,0ul>(this,uVar2 + 2);
    (this->queue).irc = (u16)uVar2;
    writeM<(moira::MemSpace)1,(moira::Size)2,4ul>(this,addr,(uint)uVar4);
  }
  return;
}

Assistant:

void
Moira::execAddRgEa(u16 opcode)
{
    u32 ea, data, result;

    int src = ____xxx_________(opcode);
    int dst = _____________xxx(opcode);

    if (!readOp<M,S, STD_AE_FRAME>(dst, ea, data)) return;
    result = addsub<I,S>(readD<S>(src), data);

    prefetch();
    writeM <M, S, POLLIPL> (ea, result);
}